

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O1

float bez2(xr_key *key0,xr_key *key1,float time)

{
  float fVar1;
  uint8_t uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float t1;
  float t0;
  float local_20;
  float local_1c;
  
  uVar2 = key0->shape;
  if (uVar2 == '\x05') {
    fVar3 = key0->param[2];
  }
  else {
    fVar3 = (key1->time - key0->time) / 3.0;
  }
  local_1c = 0.0;
  local_20 = 1.0;
  fVar3 = bez2_time(key0->time,key0->time + fVar3,key1->param[0] + key1->time,key1->time,time,
                    &local_1c,&local_20);
  if (uVar2 == '\x05') {
    fVar4 = key0->param[3];
  }
  else {
    fVar4 = key0->param[1] / 3.0;
  }
  fVar4 = key0->value + fVar4;
  fVar1 = key0->value;
  fVar5 = (fVar4 - fVar1) * 3.0;
  fVar4 = ((key1->param[1] + key1->value) - fVar4) * 3.0 - fVar5;
  return fVar5 * fVar3 +
         fVar4 * fVar3 * fVar3 + (((key1->value - fVar1) - fVar5) - fVar4) * fVar3 * fVar3 * fVar3 +
         fVar1;
}

Assistant:

static float bez2(const xr_key* key0, const xr_key* key1, float time)
{
	float x = (key0->shape == xr_key::SHAPE_BEZ2) ?
			key0->time + key0->param[2] :
			key0->time + (key1->time - key0->time)/3.f;
	float t0 = 0.f, t1 = 1.f;
	float t = bez2_time(key0->time, x, key1->time + key1->param[0], key1->time, time, &t0, &t1);

	float y = (key0->shape == xr_key::SHAPE_BEZ2) ?
			key0->value + key0->param[3] :
			key0->value + key0->param[1]/3.f;
	return bezier(key0->value, y, key1->param[1] + key1->value, key1->value, t);
}